

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* makeBlankGrid(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *__return_storage_ptr__,int size)

{
  value_type local_3c;
  int local_38;
  int local_34;
  int rows;
  int cols;
  vector<int,_std::allocator<int>_> row;
  int size_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *grid;
  
  row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 0;
  row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = size;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&rows);
  for (local_34 = 0;
      local_34 <
      row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_34 = local_34 + 1) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&rows);
    for (local_38 = 0;
        local_38 <
        row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; local_38 = local_38 + 1) {
      local_3c = 0;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&rows,&local_3c);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&rows);
  }
  row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&rows);
  if ((row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._3_1_ & 1) == 0) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<int>> makeBlankGrid(int size) {
    vector<vector<int>> grid;
    vector<int> row;
    for (int cols = 0; cols < size; cols++) {
        row.clear();
        for (int rows = 0; rows < size; rows++) {
            row.push_back(0);
        }
        grid.push_back(row);
    }
    return grid;
}